

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTWaveBank_GetState(FACTWaveBank *pWaveBank,uint32_t *pdwState)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  if (pWaveBank == (FACTWaveBank *)0x0) {
    *pdwState = 0;
    uVar2 = 1;
  }
  else {
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    *pdwState = 4;
    uVar3 = 0;
    do {
      if (pWaveBank->entryCount <= uVar3) goto LAB_0010be79;
      puVar1 = pWaveBank->entryRefs + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar1 == 0);
    *pdwState = 0x84;
LAB_0010be79:
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint32_t FACTWaveBank_GetState(
	FACTWaveBank *pWaveBank,
	uint32_t *pdwState
) {
	uint32_t i;
	if (pWaveBank == NULL)
	{
		*pdwState = 0;
		return 1;
	}

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);

	*pdwState = FACT_STATE_PREPARED;
	for (i = 0; i < pWaveBank->entryCount; i += 1)
	{
		if (pWaveBank->entryRefs[i] > 0)
		{
			*pdwState |= FACT_STATE_INUSE;
			FAudio_PlatformUnlockMutex(
				pWaveBank->parentEngine->apiLock
			);
			return 0;
		}
	}

	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}